

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::setForegroundBrush(QGraphicsScene *this,QBrush *brush)

{
  long lVar1;
  QArrayData *pQVar2;
  long lVar3;
  QWidget *this_00;
  long lVar4;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QBrush::operator=((QBrush *)(*(long *)(this + 8) + 0x178),brush);
  lVar1 = *(long *)(this + 8);
  pQVar2 = *(QArrayData **)(lVar1 + 0x280);
  lVar3 = *(long *)(lVar1 + 0x288);
  lVar1 = *(long *)(lVar1 + 0x290);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar1 != 0) {
    lVar4 = 0;
    do {
      this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)(lVar3 + lVar4));
      QWidget::update(this_00);
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  local_58.w = 0.0;
  local_58.h = 0.0;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  update(this,&local_58);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setForegroundBrush(const QBrush &brush)
{
    Q_D(QGraphicsScene);
    d->foregroundBrush = brush;
    const auto views_ = views();
    for (QGraphicsView *view : views_)
        view->viewport()->update();
    update();
}